

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintNode(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int *piVar1;
  Wlc_Obj_t *pWVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar5;
  ushort uVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  int k;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  
  printf("%8d  :  ",(ulong)(uint)((int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555));
  iVar9 = (p->vLevels).nSize;
  if (iVar9 != 0) {
    uVar7 = (int)((long)pObj - (long)p->pObjs >> 3) * -0x55555555;
    if (((int)uVar7 < 0) || (iVar9 <= (int)uVar7)) goto LAB_0036e39a;
    printf("Lev = %2d  ",(ulong)(uint)(p->vLevels).pArray[uVar7 & 0x7fffffff]);
  }
  iVar3 = pObj->End - pObj->Beg;
  iVar9 = -iVar3;
  if (0 < iVar3) {
    iVar9 = iVar3;
  }
  pcVar12 = " ";
  pcVar13 = "s";
  pcVar8 = "s";
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x40) == (undefined1  [24])0x0)
  {
    pcVar8 = " ";
  }
  printf("%6d%s = ",(ulong)(iVar9 + 1),pcVar8);
  uVar7 = *(ushort *)pObj & 0x3f;
  if ((ulong)uVar7 == 6) {
LAB_0036df6c:
    pcVar8 = "                                ";
  }
  else {
    if (uVar7 == 3) {
      pcVar8 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) {
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar7 = ((pObj->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar7 < 0) || ((p->vCos).nSize <= (int)uVar7)) {
LAB_0036e39a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = (p->vCos).pArray[uVar7];
      if ((0 < iVar9) && (iVar9 < p->nObjsAlloc)) {
        pcVar12 = Wlc_ObjName(p,iVar9);
        printf("            FO                   :    %-12s = %-12s\n",pcVar8,pcVar12);
        return;
      }
      goto LAB_0036e3b9;
    }
    if (uVar7 == 1) {
      pcVar8 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      pcVar12 = "            PI                   :    %-12s\n";
LAB_0036e183:
      printf(pcVar12,pcVar8);
      return;
    }
    uVar11 = pObj->nFanins;
    if (uVar11 == 0) {
      pcVar8 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      pcVar12 = "Unknown object without fanins    :    %-12s\n";
      goto LAB_0036e183;
    }
    if ((short)uVar7 == 6) goto LAB_0036df6c;
    if ((uVar11 < 3) && ((uVar7 | 0x10) != 0x16)) {
      paVar5 = &pObj->field_10;
    }
    else {
      paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
    }
    lVar10 = (long)paVar5->Fanins[0];
    if ((lVar10 < 1) || (p->nObjsAlloc <= paVar5->Fanins[0])) {
LAB_0036e3b9:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    pWVar2 = p->pObjs;
    iVar3 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
    iVar9 = -iVar3;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    if ((uVar11 < 3) && ((uVar7 | 0x10) != 0x16)) {
      paVar5 = &pObj->field_10;
    }
    else {
      paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
    }
    uVar11 = paVar5->Fanins[0];
    if (((long)(int)uVar11 < 1) || ((uint)p->nObjsAlloc <= uVar11)) goto LAB_0036e3b9;
    pcVar8 = "s";
    if ((undefined1  [24])((undefined1  [24])pWVar2[(int)uVar11] & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      pcVar8 = " ";
    }
    printf("%6d%s  %5s  ",(ulong)(iVar9 + 1),pcVar8,Wlc_Names[uVar7]);
    uVar7 = pObj->nFanins;
    if ((int)uVar7 < 2) {
      printf("        ");
    }
    else {
      if ((uVar7 == 2) && ((*(uint *)pObj & 0x3f | 0x10) != 0x16)) {
        paVar5 = &pObj->field_10;
      }
      else {
        paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      lVar10 = (long)paVar5->Fanins[1];
      if ((lVar10 < 1) || (p->nObjsAlloc <= paVar5->Fanins[1])) goto LAB_0036e3b9;
      pWVar2 = p->pObjs;
      iVar3 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
      iVar9 = -iVar3;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      if ((uVar7 == 2) && ((*(uint *)pObj & 0x3f | 0x10) != 0x16)) {
        paVar5 = &pObj->field_10;
      }
      else {
        paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      uVar7 = paVar5->Fanins[1];
      if (((long)(int)uVar7 < 1) || ((uint)p->nObjsAlloc <= uVar7)) goto LAB_0036e3b9;
      pcVar8 = "s";
      if ((undefined1  [24])((undefined1  [24])pWVar2[(int)uVar7] & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar8 = " ";
      }
      printf("%6d%s ",(ulong)(iVar9 + 1),pcVar8);
    }
    if (2 < (int)pObj->nFanins) {
      lVar10 = (long)(pObj->field_10).pFanins[0][2];
      if ((lVar10 < 1) || (p->nObjsAlloc <= (pObj->field_10).pFanins[0][2])) goto LAB_0036e3b9;
      pWVar2 = p->pObjs;
      iVar3 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
      iVar9 = -iVar3;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      if ((undefined1  [24])((undefined1  [24])pWVar2[lVar10] & (undefined1  [24])0x40) !=
          (undefined1  [24])0x0) {
        pcVar12 = "s";
      }
      printf("%6d%s ",(ulong)(iVar9 + 1),pcVar12);
      goto LAB_0036df7a;
    }
    pcVar8 = "        ";
  }
  printf(pcVar8);
LAB_0036df7a:
  printf(" :    ");
  pcVar8 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  printf("%-12s",pcVar8);
  uVar6 = *(ushort *)pObj & 0x3f;
  if (uVar6 == 6) {
    iVar3 = pObj->End - pObj->Beg;
    iVar9 = -iVar3;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    if ((*(ushort *)pObj & 0x40) == 0) {
      pcVar13 = "";
    }
    uVar7 = 0;
    printf(" = %d\'%sh",(ulong)(iVar9 + 1),pcVar13);
    __stream = _stdout;
    if ((*(uint *)pObj >> 0xb & 1) == 0) {
      if (((ushort)*(uint *)pObj & 0x3f) != 6) {
        __assert_fail("p->Type == WLC_OBJ_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x145,"int *Wlc_ObjConstValue(Wlc_Obj_t *)");
      }
      piVar1 = (pObj->field_10).pFanins[0];
      iVar3 = pObj->End - pObj->Beg;
      iVar9 = pObj->Beg - pObj->End;
      if (iVar9 <= iVar3) {
        iVar9 = iVar3;
      }
      uVar11 = (iVar9 + 4U >> 2) + 1;
      uVar7 = iVar9 + 4U & 0xfffffffc;
      do {
        uVar7 = uVar7 - 4;
        uVar4 = (uint)(*(ulong *)(piVar1 + (ulong)(uVar11 - 2 >> 4) * 2) >> ((byte)uVar7 & 0x3c)) &
                0xf;
        iVar9 = uVar4 + 0x30;
        if (9 < uVar4) {
          iVar9 = uVar4 + 0x57;
        }
        fputc(iVar9,__stream);
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    else {
      do {
        putchar(0x78);
        uVar7 = uVar7 + 1;
        iVar3 = pObj->End - pObj->Beg;
        iVar9 = -iVar3;
        if (0 < iVar3) {
          iVar9 = iVar3;
        }
      } while (uVar7 < iVar9 + 4U >> 2);
    }
  }
  else {
    if ((pObj->nFanins < 3) && ((uVar6 | 0x10) != 0x16)) {
      paVar5 = &pObj->field_10;
    }
    else {
      paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
    }
    pcVar8 = Wlc_ObjName(p,paVar5->Fanins[0]);
    printf(" =  %-12s  %5s  ",pcVar8,Wlc_Names[*(ushort *)pObj & 0x3f]);
    if ((int)pObj->nFanins < 2) {
      printf("             ");
    }
    else {
      if ((pObj->nFanins == 2) && ((*(uint *)pObj & 0x3f | 0x10) != 0x16)) {
        paVar5 = &pObj->field_10;
      }
      else {
        paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      pcVar8 = Wlc_ObjName(p,paVar5->Fanins[1]);
      printf("%-12s ",pcVar8);
    }
    if (2 < (int)pObj->nFanins) {
      pcVar8 = Wlc_ObjName(p,(pObj->field_10).pFanins[0][2]);
      printf("%-12s ",pcVar8);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Wlc_NtkPrintNode( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    printf( "%8d  :  ", Wlc_ObjId(p, pObj) );
    if ( Vec_IntSize(&p->vLevels) )
        printf( "Lev = %2d  ", Vec_IntEntry(&p->vLevels, Wlc_ObjId(p,pObj)) );
    printf( "%6d%s = ", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s" : " " );
    if ( pObj->Type == WLC_OBJ_PI )
    {
        printf( "            PI                   :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type == WLC_OBJ_FO )
    {
        printf( "            FO                   :    %-12s = %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST && Wlc_ObjFaninNum(pObj) == 0 )
    {
        printf( "Unknown object without fanins    :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST )
    {
        printf( "%6d%s  %5s  ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin2(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
    }
    else
        printf( "                                " );
    printf( " :    " );
    printf( "%-12s",   Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        printf( " = %d\'%sh", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s":"" );
        if ( pObj->fXConst )
        {
            int k;
            for ( k = 0; k < (Wlc_ObjRange(pObj) + 3) / 4; k++ )
                printf( "x" );
        }
        else
            Abc_TtPrintHexArrayRev( stdout, (word *)Wlc_ObjConstValue(pObj), (Wlc_ObjRange(pObj) + 3) / 4 );
    }
    else
    {
        printf( " =  %-12s  %5s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        else
            printf( "             " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId2(pObj)) );
    }
    printf( "\n" );
}